

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O3

Unit * __thiscall Kernel::Inference::next(Inference *this,Iterator *it)

{
  void **ppvVar1;
  
  if ((undefined1  [48])((undefined1  [48])*this & (undefined1  [48])0x3) == (undefined1  [48])0x0)
  {
    if ((it->field_0).integer == 0) {
      (it->field_0).integer = 1;
      ppvVar1 = &this->_ptr1;
    }
    else {
      (it->field_0).integer = 2;
      ppvVar1 = &this->_ptr2;
    }
  }
  else {
    ppvVar1 = (void **)(it->field_0).pointer;
    it->field_0 = *(anon_union_8_2_756040a0_for_Iterator_0 *)(ppvVar1 + 1);
  }
  return (Unit *)*ppvVar1;
}

Assistant:

Unit* Inference::next(Iterator& it) const
{
  switch(_kind) {
    case Kind::INFERENCE_012:
      switch(it.integer) {
      case 0:
        it.integer++;
        return static_cast<Unit*>(_ptr1);
      case 1:
        it.integer++;
        return static_cast<Unit*>(_ptr2);
      default:
        ASSERTION_VIOLATION;
        return nullptr;
      }
      break;
    case Kind::INFERENCE_MANY:
    case Kind::INFERENCE_FROM_SAT_REFUTATION: {
      UnitList* lst = static_cast<UnitList*>(it.pointer);
      it.pointer = lst->tail();
      return lst->head();
    }
    default:
      ASSERTION_VIOLATION;
      return nullptr;
  }
}